

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O0

void __thiscall miniros::TopicManager::getPublications(TopicManager *this,XmlRpcValue *pubs)

{
  bool bVar1;
  element_type *peVar2;
  string *value;
  XmlRpcValue *in_RDI;
  XmlRpcValue pub;
  PublicationPtr t;
  iterator __end2;
  iterator __begin2;
  V_Publication *__range2;
  uint32_t sidx;
  scoped_lock<std::recursive_mutex> lock;
  XmlRpcValue *in_stack_ffffffffffffff48;
  int i;
  XmlRpcValue *in_stack_ffffffffffffff50;
  XmlRpcValue *in_stack_ffffffffffffff88;
  XmlRpcValue *in_stack_ffffffffffffff90;
  XmlRpcValue local_58 [2];
  shared_ptr<miniros::Publication> *local_38;
  __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
  local_30;
  anon_union_8_8_d5adaace_for__value *local_28;
  int local_1c;
  
  XmlRpc::XmlRpcValue::setSize
            (in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_stack_ffffffffffffff50,
             (mutex_type *)in_stack_ffffffffffffff48);
  local_1c = 0;
  local_28 = &in_RDI[6]._value;
  local_30._M_current =
       (shared_ptr<miniros::Publication> *)
       std::
       vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
       ::begin((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                *)in_stack_ffffffffffffff48);
  local_38 = (shared_ptr<miniros::Publication> *)
             std::
             vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ::end((vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                    *)in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
    ::operator*(&local_30);
    std::shared_ptr<miniros::Publication>::shared_ptr
              ((shared_ptr<miniros::Publication> *)in_stack_ffffffffffffff50,
               (shared_ptr<miniros::Publication> *)in_stack_ffffffffffffff48);
    i = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    XmlRpc::XmlRpcValue::XmlRpcValue(local_58);
    peVar2 = std::
             __shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4fba4d);
    value = Publication::getName_abi_cxx11_(peVar2);
    XmlRpc::XmlRpcValue::XmlRpcValue(in_RDI,value);
    XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff50,i);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fba9b);
    peVar2 = std::
             __shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x4fbaa5);
    Publication::getDataType_abi_cxx11_(peVar2);
    XmlRpc::XmlRpcValue::XmlRpcValue(in_RDI,value);
    in_stack_ffffffffffffff50 = XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff50,i);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fbaf6);
    local_1c = local_1c + 1;
    in_stack_ffffffffffffff48 = XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff50,i);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fbb35);
    std::shared_ptr<miniros::Publication>::~shared_ptr((shared_ptr<miniros::Publication> *)0x4fbb3f)
    ;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::Publication>_*,_std::vector<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>_>
    ::operator++(&local_30);
  }
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x4fbbd3);
  return;
}

Assistant:

void TopicManager::getPublications(XmlRpcValue& pubs)
{
  // force these guys to be arrays, even if we don't populate them
  pubs.setSize(0);

  {
    std::scoped_lock<std::recursive_mutex> lock(advertised_topics_mutex_);

    uint32_t sidx = 0;

    for (PublicationPtr t: advertised_topics_) {
      XmlRpcValue pub;
      pub[0] = t->getName();
      pub[1] = t->getDataType();
      pubs[sidx++] = pub;
    }
  }
}